

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall
Search::search::get_test_action_sequence
          (search *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *V)

{
  value_type *pvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  size_t i;
  value_type *__x;
  value_type *local_18;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3be6c2);
  local_18 = (value_type *)0x0;
  while( true ) {
    __x = local_18;
    pvVar1 = (value_type *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        ((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start + 0x5e));
    if (pvVar1 <= __x) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start + 0x5e),(size_type)local_18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(in_RDI,__x);
    local_18 = (value_type *)((long)local_18 + 1);
  }
  return;
}

Assistant:

void search::get_test_action_sequence(vector<action>& V)
{
  V.clear();
  for (size_t i = 0; i < this->priv->test_action_sequence.size(); i++) V.push_back(this->priv->test_action_sequence[i]);
}